

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall TapBranch_Empty_Test::TestBody(TapBranch_Empty_Test *this)

{
  byte bVar1;
  char *pcVar2;
  char *in_R9;
  bool is_parity;
  Privkey sk;
  SchnorrSignature sig;
  undefined7 uStack_16f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168 [4];
  AssertionResult gtest_ar_1;
  AssertHelper local_128;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  ByteData256 msg;
  SchnorrPubkey schnorr_pubkey;
  TapBranch tree;
  Privkey key;
  SchnorrPubkey pk;
  Pubkey pubkey;
  AssertionResult gtest_ar__2;
  
  std::__cxx11::string::string
            ((string *)&tree,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)&sig);
  cfd::core::Privkey::Privkey(&key,(string *)&tree,kMainnet,true);
  std::__cxx11::string::~string((string *)&tree);
  cfd::core::Privkey::GeneratePubkey(SUB81(&pubkey,0));
  cfd::core::SchnorrPubkey::FromPubkey((Pubkey *)&schnorr_pubkey,(bool *)&pubkey);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&sig,"\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\""
             ,"schnorr_pubkey.GetHex()",(char (*) [65])0x3657a6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree);
  std::__cxx11::string::~string((string *)&tree);
  if (sig == (SchnorrSignature)0x0) {
    testing::Message::Message((Message *)&tree);
    if (local_168[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_168[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&tree);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_168);
  sig = (SchnorrSignature)0x0;
  local_168[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&sk);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&tree,(internal *)&sig,(AssertionResult *)"is_parity","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
             ,0x1f,_tree);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&sk);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&tree);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&sk);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_168);
  cfd::core::TapBranch::TapBranch(&tree);
  cfd::core::TapBranch::GetBaseHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_1,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",
             "tree.GetBaseHash().GetHex()",(char (*) [65])0x371a57,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&sig);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::TapBranch::GetCurrentBranchHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_1,
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",
             "tree.GetCurrentBranchHash().GetHex()",(char (*) [65])0x371a57,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&sig);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::TapBranch::GetTweakedPubkey((SchnorrPubkey *)&sk,(bool *)&tree);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_1,
             "\"cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a\"",
             "tree.GetTweakedPubkey(schnorr_pubkey).GetHex()",
             (char (*) [65])"cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&sig);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::TapBranch::GetTweakedPrivkey(&sk,(bool *)&tree);
  cfd::core::Privkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_1,
             "\"3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a\"",
             "tree.GetTweakedPrivkey(key).GetHex()",
             (char (*) [65])"3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&sig);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bVar1 = cfd::core::TapBranch::HasTapLeaf();
  sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar1 ^ 1;
  sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sig,(internal *)&sk,(AssertionResult *)"tree.HasTapLeaf()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x2a,(char *)CONCAT71(uStack_16f,sig));
    testing::internal::AssertHelper::operator=((AssertHelper *)&msg,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&msg);
    std::__cxx11::string::~string((string *)&sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::TapBranch::ToString_abi_cxx11_();
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&sk,"\"\"","tree.ToString()",(char (*) [1])0x3b72e3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  if ((byte)sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start == 0) {
    testing::Message::Message((Message *)&sig);
    if (sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      pcVar2 = *(char **)sk.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&sig,"e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02",
             (allocator *)&sk);
  cfd::core::ByteData256::ByteData256(&msg,(string *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  cfd::core::TapBranch::GetTweakedPubkey(&pk,(bool *)&tree);
  cfd::core::TapBranch::GetTweakedPrivkey(&sk,(bool *)&tree);
  cfd::core::SchnorrUtil::Sign((ByteData256 *)&sig,(Privkey *)&msg);
  gtest_ar__2.success_ =
       (bool)cfd::core::SchnorrPubkey::Verify((SchnorrSignature *)&pk,(ByteData256 *)&sig);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1,(internal *)&gtest_ar__2,
               (AssertionResult *)"pk.Verify(sig, msg)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x31,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&msg);
  cfd::core::TapBranch::~TapBranch(&tree);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TapBranch, Empty) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  TapBranch tree;
  EXPECT_EQ("0000000000000000000000000000000000000000000000000000000000000000",
      tree.GetBaseHash().GetHex());
  EXPECT_EQ("0000000000000000000000000000000000000000000000000000000000000000",
      tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a",
      tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  EXPECT_EQ("3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a",
      tree.GetTweakedPrivkey(key).GetHex());
  EXPECT_FALSE(tree.HasTapLeaf());
  EXPECT_EQ("", tree.ToString());

  ByteData256 msg("e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02");
  auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  auto sk = tree.GetTweakedPrivkey(key);
  auto sig = SchnorrUtil::Sign(msg, sk);
  EXPECT_TRUE(pk.Verify(sig, msg));
}